

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitLogicalCount(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                  *this,LogicalCountExpr e)

{
  Writer *pWVar1;
  char *__s;
  Buffer<char> *pBVar2;
  size_t sVar3;
  long lVar4;
  size_t __n;
  ptrdiff_t _Num;
  ulong uVar5;
  char *str;
  
  pWVar1 = this->writer_;
  __s = internal::ExprInfo::INFO
        [*(uint *)e.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_].
        str;
  __n = strlen(__s);
  pBVar2 = pWVar1->buffer_;
  uVar5 = pBVar2->size_ + __n;
  if (pBVar2->capacity_ < uVar5) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar5);
  }
  if (__n != 0) {
    memmove(pBVar2->ptr_ + pBVar2->size_,__s,__n);
  }
  pBVar2->size_ = uVar5;
  pBVar2 = pWVar1->buffer_;
  if (pBVar2->size_ == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,pBVar2->size_ + 1);
  }
  sVar3 = pBVar2->size_;
  pBVar2->size_ = sVar3 + 1;
  pBVar2->ptr_[sVar3] = ' ';
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_ +
             8))->impl_,-1);
  pBVar2 = this->writer_->buffer_;
  if (pBVar2->size_ == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,pBVar2->size_ + 1);
  }
  sVar3 = pBVar2->size_;
  pBVar2->size_ = sVar3 + 1;
  pBVar2->ptr_[sVar3] = ' ';
  lVar4 = *(long *)((long)e.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.
                          impl_ + 0x10);
  ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
  WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>>
            ((ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
              *)this,(Impl **)(lVar4 + 8),(Impl **)(lVar4 + (long)*(int *)(lVar4 + 4) * 8 + 8),", ",
             0);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitLogicalCount(LogicalCountExpr e) {
  writer_ << str(e.kind()) << ' ';
  Visit(e.lhs());
  writer_ << ' ';
  WriteArgs(e.rhs());
}